

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O0

void __thiscall
slang::analysis::ClockVisitor::SeqExprVisitor::visit<slang::ast::ConstraintList>
          (SeqExprVisitor *this,ConstraintList *expr)

{
  ast::ConstraintList::visitExprs<slang::analysis::ClockVisitor::SeqExprVisitor&>
            ((ConstraintList *)this,(SeqExprVisitor *)expr);
  return;
}

Assistant:

void visit(const T& expr) {
            if constexpr (std::is_same_v<T, AssertionInstanceExpression>) {
                auto result = parent.visit(expr, outerClock, flags);
                if (!result.clocks.empty()) {
                    lastEndClock = result.endClock == nullptr ? result.clocks.back()
                                                              : result.endClock;
                }
            }

            if constexpr (HasVisitExprs<T, SeqExprVisitor>) {
                expr.visitExprs(*this);
                if constexpr (std::is_same_v<T, CallExpression>) {
                    if (!parent.globalFutureSampledValueCall &&
                        SemanticFacts::isGlobalFutureSampledValueFunc(expr.getKnownSystemName())) {
                        parent.globalFutureSampledValueCall = &expr;
                        parent.checkGFSVC();
                    }

                    if (lastEndClock && outerClock) {
                        // The end clock of a sequence used with .triggered or .matched
                        // must match the outer clock.
                        if (!isSameClock(*outerClock, *lastEndClock)) {
                            parent.bad = true;
                            auto& diag = parent.context.addDiag(parent.parentSymbol,
                                                                diag::SeqMethodEndClock,
                                                                expr.sourceRange);
                            diag << expr.getSubroutineName();
                            diag.addNote(diag::NoteClockHere, outerClock->sourceRange);
                            diag.addNote(diag::NoteClockHere, lastEndClock->sourceRange);
                        }
                        lastEndClock = nullptr;
                    }
                }
            }
        }